

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump-to-file-example.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  MyClass *__s;
  ulong local_40;
  uint64_t memLeakSize;
  size_t memLeakCount;
  MyClass *myClassArr;
  MyClass *myClass;
  int *num;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  num = (int *)argv;
  argv_local._0_4_ = argc;
  MemPlumber::start(true,"mem_allocations.log",false);
  myClass = (MyClass *)operator_new(4);
  myClass->x = 100;
  __s = (MyClass *)operator_new(4);
  memset(__s,0,4);
  myClassArr = __s;
  memLeakCount = (size_t)operator_new__(0x28);
  MemPlumber::memLeakCheck(&memLeakSize,&local_40,true,"mem_leak_test.log",false);
  printf("1st run. Number of leaked objects: %d\nTotal amount of memory leaked: %d[bytes]\n",
         memLeakSize & 0xffffffff,local_40 & 0xffffffff);
  if (myClass != (MyClass *)0x0) {
    operator_delete(myClass,4);
  }
  if (memLeakCount != 0) {
    operator_delete__((void *)memLeakCount);
  }
  MemPlumber::memLeakCheck(&memLeakSize,&local_40,true,"mem_leak_test.log",true);
  printf("\n2nd run. Number of leaked objects: %d\nTotal amount of memory leaked: %d[bytes]\n",
         memLeakSize & 0xffffffff,local_40 & 0xffffffff);
  MemPlumber::stopAndFreeAllMemory();
  return 0;
}

Assistant:

int main( int argc, const char* argv[]) {

    // start collecting mem allocations info and dump info to "mem_allocations.log"
    MemPlumber::start(true, "mem_allocations.log");

    // init 2 objects
    int* num = new int(100);
    MyClass* myClass = new MyClass();

    // init 1 array of 10 objects
    MyClass* myClassArr = new MyClass[10];

    // run memory leak test in verbose mode and dump info to "mem_leak_test.log"
    size_t memLeakCount; 
    uint64_t memLeakSize;
    MemPlumber::memLeakCheck(memLeakCount, memLeakSize, true, "mem_leak_test.log");

    // print memory leak results
    printf("1st run. Number of leaked objects: %d\nTotal amount of memory leaked: %d[bytes]\n", (int)memLeakCount, (int)memLeakSize);

    // free some memory (this will also be written to "mem_allocations.log")
    delete num;
    delete [] myClassArr;

    // run memory leak test again in verbose mode and dump info to the same file "mem_leak_test.log" but in append mode
    // this time we're expecting to find only 1 leaked object (myClass) since the other were already freed
    MemPlumber::memLeakCheck(memLeakCount, memLeakSize, true, "mem_leak_test.log", true);

    // print memory leak results
    printf("\n2nd run. Number of leaked objects: %d\nTotal amount of memory leaked: %d[bytes]\n", (int)memLeakCount, (int)memLeakSize);

    // stop collecting mem allocations info and clean the reminaing mem leaks. This will also be dumped to "mem_allocations.log"
    MemPlumber::stopAndFreeAllMemory();

    return 0;
}